

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O0

ConversionResult
convertUTF::ConvertUTF16toUTF32
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  UTF32 *pUVar1;
  uint uVar2;
  UTF32 *pUVar3;
  uint local_4c;
  UTF32 ch2;
  UTF32 ch;
  UTF16 *oldSource;
  UTF32 *target;
  UTF16 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF32 *targetEnd_local;
  UTF32 **targetStart_local;
  UTF16 *sourceEnd_local;
  UTF16 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF32 *)*sourceStart;
  oldSource = (UTF16 *)*targetStart;
  do {
    pUVar1 = target;
    if (sourceEnd <= target) {
LAB_002949ba:
      *sourceStart = (UTF16 *)pUVar1;
      *targetStart = (UTF32 *)oldSource;
      return (ConversionResult)source;
    }
    pUVar3 = (UTF32 *)((long)target + 2);
    local_4c = (uint)(ushort)*target;
    if ((local_4c < 0xd800) || (0xdbff < local_4c)) {
      target = pUVar3;
      if ((flags == strictConversion) && ((0xdbff < local_4c && (local_4c < 0xe000)))) {
        source._0_4_ = sourceIllegal;
        goto LAB_002949ba;
      }
    }
    else {
      if (sourceEnd <= pUVar3) {
        source._0_4_ = sourceExhausted;
        goto LAB_002949ba;
      }
      uVar2 = (uint)*(ushort *)pUVar3;
      if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
        target = pUVar3;
        if (flags == strictConversion) {
          source._0_4_ = sourceIllegal;
          goto LAB_002949ba;
        }
      }
      else {
        local_4c = (local_4c - 0xd800) * 0x400 + uVar2 + 0x2400;
        target = target + 1;
      }
    }
    if (targetEnd <= oldSource) {
      source._0_4_ = targetExhausted;
      goto LAB_002949ba;
    }
    *(uint *)oldSource = local_4c;
    oldSource = oldSource + 2;
  } while( true );
}

Assistant:

ConversionResult ConvertUTF16toUTF32(const UTF16** sourceStart, const UTF16* sourceEnd, UTF32** targetStart,
                                     const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF16* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        const UTF16* oldSource = source; /*  In case we have to back up because of target overflow. */
        UTF32 ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END)
        {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd)
            {
                UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END)
                {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift) + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                }
                else if (flags == ConversionFlags::strictConversion)
                {             /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
            }
            else
            {             /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = ConversionResult::sourceExhausted;
                break;
            }
        }
        else if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        if (target >= targetEnd)
        {
            source = oldSource; /* Back up source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        *target++ = ch;
    }
    *sourceStart = source;
    *targetStart = target;
#ifdef CVTUTF_DEBUG
    if (result == sourceIllegal)
    {
        fprintf(stderr, "ConvertUTF16toUTF32 illegal seq 0x%04x,%04x\n", ch, ch2);
        fflush(stderr);
    }
#endif
    return result;
}